

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

string * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,PsbtGlobalXpubStruct>::
Serialize_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long *plVar1;
  bool bVar2;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var3;
  long *plVar4;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  string item;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  value_type local_50;
  
  local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
  p_Var3 = &local_68;
  local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_68._M_impl._M_node._M_size = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar1 = *(long **)((long)this + 0x10);
  for (plVar4 = *(long **)((long)this + 8); plVar4 != plVar1; plVar4 = plVar4 + 0x22) {
    (**(code **)(*plVar4 + 0x30))(&local_50,plVar4);
    ::std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
  bVar2 = true;
  while (p_Var3 = *(_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    **)p_Var3, p_Var3 != &local_68) {
    if (!bVar2) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    bVar2 = false;
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_68);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Serialize() const {
    std::string result;
    std::list<std::string> str_list;
    for (auto& element : *this) {
      std::string item = element.Serialize();
      str_list.push_back(item);
    }

    result = "[";
    bool is_first = true;
    for (const auto& item : str_list) {
      if (!is_first) {
        result += ",";
      }
      result += item;
      is_first = false;
    }
    result += "]";

    return result;
  }